

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char  [7] __thiscall
kj::str<kj::_::DebugComparison<kj::Maybe<unsigned_int&>,kj::None_const&>&>
          (kj *this,DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *params)

{
  DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *value;
  String local_30;
  DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *local_18;
  DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *params_local;
  
  local_18 = params;
  params_local = (DebugComparison<kj::Maybe<unsigned_int_&>,_const_kj::None_&> *)this;
  value = fwd<kj::_::DebugComparison<kj::Maybe<unsigned_int&>,kj::None_const&>&>(params);
  toCharSequence<kj::_::DebugComparison<kj::Maybe<unsigned_int&>,kj::None_const&>&>
            ((kj *)&local_30,value);
  _::concat((String *)this,&local_30);
  String::~String(&local_30);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}